

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void set_want_move_all_wins(Am_Object *root_window,bool want_move)

{
  bool bVar1;
  Am_Value *this;
  Am_Object win;
  Am_Instance_Iterator instance_iter;
  Am_Object AStack_68;
  Am_Object local_60;
  Am_Instance_Iterator local_58;
  Am_Object local_48;
  Am_Instance_Iterator local_40;
  
  Am_Object::Am_Object(&local_40.prototype,root_window);
  Am_Instance_Iterator::Am_Instance_Iterator(&local_58,&local_40.prototype);
  Am_Object::~Am_Object(&local_40.prototype);
  local_60.data = (Am_Object_Data *)0x0;
  Am_Instance_Iterator::Start(&local_58);
  while (bVar1 = Am_Instance_Iterator::Last(&local_58), !bVar1) {
    Am_Instance_Iterator::Get(&local_40);
    Am_Object::operator=(&local_60,&local_40.current);
    Am_Object::~Am_Object(&local_40.current);
    this = Am_Object::Get(&local_60,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    if (bVar1) {
      Am_Object::Get_Object(&AStack_68,(Am_Slot_Key)&local_60,10);
      bVar1 = Am_Object::Valid(&AStack_68);
      Am_Object::~Am_Object(&AStack_68);
    }
    else {
      bVar1 = false;
    }
    if (bVar1 != false) {
      Am_Object::Am_Object(&local_48,&local_60);
      set_want_move_one_win(&local_48,want_move);
      Am_Object::~Am_Object(&local_48);
    }
    set_want_move_all_wins(&local_60,want_move);
    Am_Instance_Iterator::Next(&local_58);
  }
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58.prototype);
  Am_Object::~Am_Object(&local_58.current);
  return;
}

Assistant:

static void
set_want_move_all_wins(const Am_Object &root_window, bool want_move)
{
  Am_Instance_Iterator instance_iter(root_window);
  Am_Object win;
  for (instance_iter.Start(); !instance_iter.Last(); instance_iter.Next()) {
    win = instance_iter.Get();
    if ((bool)win.Get(Am_VISIBLE) && win.Get_Owner().Valid())
      //just visible windows
      set_want_move_one_win(win, want_move);
    //recurse on instance
    set_want_move_all_wins(win, want_move);
  }
}